

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O2

void __thiscall DSeqActorNode::MakeSound(DSeqActorNode *this,int loop,FSoundID *id)

{
  AActor *ent;
  float volume;
  float fVar1;
  FSoundID local_1c;
  
  ent = GC::ReadBarrier<AActor>((AActor **)&this->m_Actor);
  local_1c = (FSoundID)id->ID;
  fVar1 = (this->super_DSeqNode).m_Volume;
  if (1.0 <= fVar1) {
    fVar1 = 1.0;
  }
  volume = 0.0;
  if (0.0 <= fVar1) {
    volume = fVar1;
  }
  S_Sound(ent,loop | 4,&local_1c,volume,(this->super_DSeqNode).m_Atten);
  return;
}

Assistant:

void MakeSound(int loop, FSoundID id)
	{
		S_Sound(m_Actor, CHAN_BODY|loop, id, clamp(m_Volume, 0.f, 1.f), m_Atten);
	}